

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

void memory_tree_ns::copy_example_data(example *dst,example *src,int oas)

{
  polylabel *this;
  wclass *pwVar1;
  uint *_begin;
  label_t lVar2;
  size_t sVar3;
  
  if (oas == 0) {
    (dst->l).cb_eval.event.costs.erase_count = (src->l).cb_eval.event.costs.erase_count;
    lVar2 = (src->l).multi;
    pwVar1 = (src->l).cs.costs._end;
    sVar3 = (src->l).cs.costs.erase_count;
    (dst->l).cs.costs.end_array = (src->l).cs.costs.end_array;
    (dst->l).cs.costs.erase_count = sVar3;
    (dst->l).multi = lVar2;
    (dst->l).cs.costs._end = pwVar1;
    (dst->l).simple.label = (src->l).simple.label;
  }
  else {
    this = &dst->l;
    pwVar1 = (dst->l).cs.costs._begin;
    if (pwVar1 != (wclass *)0x0) {
      free(pwVar1);
    }
    (this->cs).costs._begin = (wclass *)0x0;
    (dst->l).cs.costs._end = (wclass *)0x0;
    (dst->l).cs.costs.end_array = (wclass *)0x0;
    v_array<unsigned_int>::clear((v_array<unsigned_int> *)&this->simple);
    _begin = (src->l).multilabels.label_v._begin;
    push_many<unsigned_int>
              ((v_array<unsigned_int> *)&this->simple,_begin,
               (long)(src->l).cs.costs._end - (long)_begin >> 2);
  }
  VW::copy_example_data(false,dst,src);
  return;
}

Assistant:

void copy_example_data(example* dst, example* src, int oas = false) //copy example data. 
    { 
        if (oas == false){
            dst->l = src->l;
            dst->l.multi.label = src->l.multi.label;
        }
        else{
            dst->l.multilabels.label_v.delete_v();
            copy_array(dst->l.multilabels.label_v, src->l.multilabels.label_v);
        }
        VW::copy_example_data(false, dst, src);
    }